

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

void __thiscall CLI::Validator::Validator(Validator *this,string *validator_desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_class_32_1_5ff8519c local_38;
  
  paVar1 = &local_38.validator_desc.field_2;
  pcVar2 = (validator_desc->_M_dataplus)._M_p;
  local_38.validator_desc._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + validator_desc->_M_string_length);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.validator_desc._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.validator_desc._M_dataplus._M_p,
                    local_38.validator_desc.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Validators.hpp:87:53)>
       ::_M_invoke;
  (this->func_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Validators.hpp:87:53)>
       ::_M_manager;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}